

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unicodeNext(sqlite3_tokenizer_cursor *pC,char **paToken,int *pnToken,int *piStart,int *piEnd,
               int *piPos)

{
  unicode_tokenizer *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  sqlite3_tokenizer *psVar4;
  long lVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  ulong uVar14;
  byte *pbVar15;
  sqlite3_tokenizer *local_68;
  
  p = (unicode_tokenizer *)pC->pTokenizer;
  pbVar15 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)*(int *)&pC[2].pTokenizer);
  pbVar9 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)*(int *)((long)&pC[2].pTokenizer + 4)
                   );
  do {
    pbVar7 = pbVar9;
    if (pbVar15 <= pbVar7) {
      return 0x65;
    }
    pbVar8 = pbVar7 + 1;
    bVar13 = *pbVar7;
    uVar14 = (ulong)bVar13;
    pbVar9 = pbVar8;
    if (0xbf < bVar13) {
      uVar1 = (uint)""[bVar13 - 0xc0];
      for (; (pbVar9 = pbVar15, pbVar8 != pbVar15 &&
             (pbVar9 = pbVar8, (*pbVar8 & 0xffffffc0) == 0x80)); pbVar8 = pbVar8 + 1) {
        uVar1 = uVar1 << 6 | *pbVar8 & 0x3f;
      }
      uVar14 = (ulong)uVar1;
      if ((uVar1 & 0xfffff800) == 0xd800) {
        uVar14 = 0xfffd;
      }
      if (uVar1 < 0x80) {
        uVar14 = 0xfffd;
      }
      if ((uVar1 & 0xfffffffe) == 0xfffe) {
        uVar14 = 0xfffd;
      }
    }
    iVar2 = unicodeIsAlnum(p,(int)uVar14);
  } while (iVar2 == 0);
  psVar4 = pC[4].pTokenizer;
  local_68 = psVar4;
  do {
    if ((long)*(int *)&pC[5].pTokenizer + -4 <= (long)local_68 - (long)psVar4) {
      psVar4 = (sqlite3_tokenizer *)sqlite3_realloc64(psVar4,(long)*(int *)&pC[5].pTokenizer + 0x40)
      ;
      if (psVar4 == (sqlite3_tokenizer *)0x0) {
        return 7;
      }
      local_68 = (sqlite3_tokenizer *)(((long)local_68 - (long)pC[4].pTokenizer) + (long)psVar4);
      pC[4].pTokenizer = psVar4;
      *(int *)&pC[5].pTokenizer = *(int *)&pC[5].pTokenizer + 0x40;
    }
    uVar1 = (uint)uVar14;
    if ((int)uVar1 < 0x80) {
      if (uVar1 - 0x41 < 0x1a) {
        uVar14 = (ulong)(uVar1 | 0x20);
LAB_001b1305:
        uVar1 = (uint)uVar14;
        bVar13 = (byte)uVar14;
        if ((int)uVar1 < 0x80) {
          *(byte *)&local_68->pModule = bVar13;
          local_68 = (sqlite3_tokenizer *)((long)&local_68->pModule + 1);
        }
        else if (uVar1 < 0x800) {
          *(byte *)&local_68->pModule = (byte)(uVar14 >> 6) | 0xc0;
          *(byte *)((long)&local_68->pModule + 1) = bVar13 & 0x3f | 0x80;
          local_68 = (sqlite3_tokenizer *)((long)&local_68->pModule + 2);
        }
        else {
          if (0xffff < uVar1) goto LAB_001b1371;
          *(byte *)&local_68->pModule = (byte)(uVar14 >> 0xc) | 0xe0;
          *(byte *)((long)&local_68->pModule + 1) = (byte)(uVar14 >> 6) & 0x3f | 0x80;
          *(byte *)((long)&local_68->pModule + 2) = bVar13 & 0x3f | 0x80;
          local_68 = (sqlite3_tokenizer *)((long)&local_68->pModule + 3);
        }
      }
      else {
LAB_001b1300:
        if ((int)uVar14 != 0) goto LAB_001b1305;
      }
    }
    else {
      if (uVar1 < 0x10000) {
        iVar2 = 0xa2;
        iVar12 = 0;
        iVar11 = -1;
        while (iVar10 = iVar2, iVar12 <= iVar10) {
          iVar3 = (iVar10 + iVar12) / 2;
          iVar2 = iVar3 + -1;
          if ((int)(uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + (long)iVar3 * 4) <= (int)uVar1)
          {
            iVar2 = iVar10;
            iVar12 = iVar3 + 1;
            iVar11 = iVar3;
          }
        }
        lVar5 = (long)iVar11;
        if (((int)uVar1 <
             (int)((uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar5 * 4 + 3] +
                  (uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar5 * 4))) &&
           (((*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar5 * 4) ^ uVar1) &
             (uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar5 * 4 + 2] & 1) == 0)) {
          uVar14 = (ulong)(ushort)((short)uVar14 +
                                  *(short *)((long)sqlite3Fts5UnicodeFold::aiOff +
                                            (ulong)((byte)sqlite3FtsUnicodeFold_aEntry
                                                          [lVar5 * 4 + 2] & 0xfffffffe)));
        }
        if (p->eRemoveDiacritic != 0) {
          iVar2 = 0x7d;
          iVar12 = 0;
          iVar11 = 0;
          while (iVar10 = iVar2, iVar12 <= iVar10) {
            iVar3 = (iVar12 + iVar10) / 2;
            iVar2 = iVar3 + -1;
            if ((uint)*(ushort *)(&DAT_001e9ff0 + (long)iVar3 * 2) <= (int)uVar14 * 8 + 7U) {
              iVar2 = iVar10;
              iVar12 = iVar3 + 1;
              iVar11 = iVar3;
            }
          }
          lVar5 = (long)iVar11;
          if ((p->eRemoveDiacritic == 2) || (-1 < (char)(&DAT_001ea0f0)[lVar5])) {
            if ((int)((*(ushort *)(&DAT_001e9ff0 + lVar5 * 2) & 7) +
                     (uint)(*(ushort *)(&DAT_001e9ff0 + lVar5 * 2) >> 3)) < (int)uVar14)
            goto LAB_001b1305;
            uVar14 = (ulong)((byte)(&DAT_001ea0f0)[lVar5] & 0x7f);
          }
        }
        goto LAB_001b1300;
      }
      uVar6 = uVar1 + 0x28;
      if (0x27 < uVar1 - 0x10400) {
        uVar6 = uVar1;
      }
      uVar14 = (ulong)uVar6;
LAB_001b1371:
      *(uint *)&local_68->pModule =
           ((uint)uVar14 << 0x18 |
           ((uint)uVar14 & 0x3fc0) << 10 |
           (uint)(uVar14 >> 0x12) & 0xff | (uint)(uVar14 >> 4) & 0xff00) & (uint)DAT_001ea440 |
           (uint)DAT_001ea450;
      local_68 = (sqlite3_tokenizer *)((long)&local_68->pModule + 4);
    }
    pbVar8 = pbVar9;
    if (pbVar15 <= pbVar9) {
LAB_001b1484:
      *(int *)((long)&pC[2].pTokenizer + 4) = (int)pbVar8 - *(int *)&pC[1].pTokenizer;
      psVar4 = pC[4].pTokenizer;
      *paToken = (char *)psVar4;
      *pnToken = (int)local_68 - (int)psVar4;
      iVar2 = *(int *)&pC[1].pTokenizer;
      *piStart = (int)pbVar7 - iVar2;
      *piEnd = (int)pbVar9 - iVar2;
      iVar2 = *(int *)&pC[3].pTokenizer;
      *(int *)&pC[3].pTokenizer = iVar2 + 1;
      *piPos = iVar2;
      return 0;
    }
    pbVar8 = pbVar9 + 1;
    bVar13 = *pbVar9;
    uVar14 = (ulong)bVar13;
    if (0xbf < bVar13) {
      uVar1 = (uint)""[bVar13 - 0xc0];
      for (; (pbVar8 != pbVar15 && ((*pbVar8 & 0xffffffc0) == 0x80)); pbVar8 = pbVar8 + 1) {
        uVar1 = uVar1 << 6 | *pbVar8 & 0x3f;
      }
      uVar14 = (ulong)uVar1;
      if ((uVar1 & 0xfffff800) == 0xd800) {
        uVar14 = 0xfffd;
      }
      if (uVar1 < 0x80) {
        uVar14 = 0xfffd;
      }
      if ((uVar1 & 0xfffffffe) == 0xfffe) {
        uVar14 = 0xfffd;
      }
    }
    iVar2 = unicodeIsAlnum(p,(int)uVar14);
    if ((iVar2 == 0) && (iVar2 = sqlite3FtsUnicodeIsdiacritic((int)uVar14), iVar2 == 0))
    goto LAB_001b1484;
    psVar4 = pC[4].pTokenizer;
    pbVar9 = pbVar8;
  } while( true );
}

Assistant:

static int unicodeNext(
  sqlite3_tokenizer_cursor *pC,   /* Cursor returned by simpleOpen */
  const char **paToken,           /* OUT: Token text */
  int *pnToken,                   /* OUT: Number of bytes at *paToken */
  int *piStart,                   /* OUT: Starting offset of token */
  int *piEnd,                     /* OUT: Ending offset of token */
  int *piPos                      /* OUT: Position integer of token */
){
  unicode_cursor *pCsr = (unicode_cursor *)pC;
  unicode_tokenizer *p = ((unicode_tokenizer *)pCsr->base.pTokenizer);
  unsigned int iCode = 0;
  char *zOut;
  const unsigned char *z = &pCsr->aInput[pCsr->iOff];
  const unsigned char *zStart = z;
  const unsigned char *zEnd;
  const unsigned char *zTerm = &pCsr->aInput[pCsr->nInput];

  /* Scan past any delimiter characters before the start of the next token.
  ** Return SQLITE_DONE early if this takes us all the way to the end of 
  ** the input.  */
  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    if( unicodeIsAlnum(p, (int)iCode) ) break;
    zStart = z;
  }
  if( zStart>=zTerm ) return SQLITE_DONE;

  zOut = pCsr->zToken;
  do {
    int iOut;

    /* Grow the output buffer if required. */
    if( (zOut-pCsr->zToken)>=(pCsr->nAlloc-4) ){
      char *zNew = sqlite3_realloc64(pCsr->zToken, pCsr->nAlloc+64);
      if( !zNew ) return SQLITE_NOMEM;
      zOut = &zNew[zOut - pCsr->zToken];
      pCsr->zToken = zNew;
      pCsr->nAlloc += 64;
    }

    /* Write the folded case of the last character read to the output */
    zEnd = z;
    iOut = sqlite3FtsUnicodeFold((int)iCode, p->eRemoveDiacritic);
    if( iOut ){
      WRITE_UTF8(zOut, iOut);
    }

    /* If the cursor is not at EOF, read the next character */
    if( z>=zTerm ) break;
    READ_UTF8(z, zTerm, iCode);
  }while( unicodeIsAlnum(p, (int)iCode) 
       || sqlite3FtsUnicodeIsdiacritic((int)iCode)
  );

  /* Set the output variables and return. */
  pCsr->iOff = (int)(z - pCsr->aInput);
  *paToken = pCsr->zToken;
  *pnToken = (int)(zOut - pCsr->zToken);
  *piStart = (int)(zStart - pCsr->aInput);
  *piEnd = (int)(zEnd - pCsr->aInput);
  *piPos = pCsr->iToken++;
  return SQLITE_OK;
}